

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_isNameChar(int c,int bNameChar)

{
  int iVar1;
  int bNameChar_local;
  int c_local;
  
  iVar1 = Parser_isCharInTable(c,Letter,0xcf);
  if (iVar1 == 0) {
    if ((bNameChar != 0) && (iVar1 = Parser_isCharInTable(c,NameChar,0x7b), iVar1 != 0)) {
      return 1;
    }
    bNameChar_local = 0;
  }
  else {
    bNameChar_local = 1;
  }
  return bNameChar_local;
}

Assistant:

static int Parser_isNameChar(
	/*! [in] The character to check. */
	int c,
	/*! [in] 1 if you also want to check in the NameChar table. */
	int bNameChar)
{
	if (Parser_isCharInTable(c, Letter, (int)LETTERTABLESIZE)) {
		return 1;
	}

	if (bNameChar &&
		Parser_isCharInTable(c, NameChar, (int)NAMECHARTABLESIZE)) {
		return 1;
	}

	return 0;
}